

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.h
# Opt level: O2

void __thiscall
google::protobuf::internal::ExtensionSet::GrowCapacity
          (ExtensionSet *this,size_t minimum_new_capacity)

{
  ArenaImpl *this_00;
  ushort uVar1;
  KeyValue *flat;
  KeyValue *pKVar2;
  KeyValue *pKVar3;
  const_iterator __pos;
  size_t n;
  ulong n_00;
  KeyValue *it;
  bool bVar4;
  pair<const_int,_google::protobuf::internal::ExtensionSet::Extension> local_58;
  KeyValue *local_38;
  
  uVar1 = this->flat_capacity_;
  if (uVar1 < minimum_new_capacity && uVar1 < 0x101) {
    do {
      bVar4 = uVar1 == 0;
      uVar1 = uVar1 * 4;
      if (bVar4) {
        uVar1 = 1;
      }
    } while (uVar1 < minimum_new_capacity);
    this->flat_capacity_ = uVar1;
    flat = flat_begin(this);
    pKVar2 = flat_end(this);
    this_00 = (ArenaImpl *)this->arena_;
    if (this->flat_capacity_ < 0x101) {
      n_00 = (ulong)this->flat_capacity_ << 5;
      if (this_00 == (ArenaImpl *)0x0) {
        pKVar3 = (KeyValue *)operator_new__(n_00);
      }
      else {
        Arena::AllocHook((Arena *)this_00,(type_info *)&KeyValue::typeinfo,n_00);
        pKVar3 = (KeyValue *)Arena::AllocateAlignedNoHook((Arena *)this_00,n_00);
      }
      (this->map_).flat = pKVar3;
      if ((long)pKVar2 - (long)flat != 0) {
        memmove(pKVar3,flat,(long)pKVar2 - (long)flat);
      }
    }
    else {
      if (this_00 == (ArenaImpl *)0x0) {
        pKVar3 = (KeyValue *)operator_new(0x30);
        (pKVar3->second).type = '\0';
        (pKVar3->second).is_repeated = false;
        (pKVar3->second).field_0xa = 0;
        (pKVar3->second).is_packed = false;
        (pKVar3->second).cached_size = 0;
        (pKVar3->second).descriptor = (FieldDescriptor *)0x0;
        *(undefined8 *)pKVar3 = 0;
        (pKVar3->second).field_0.int64_value = 0;
      }
      else {
        Arena::AllocHook((Arena *)this_00,
                         (type_info *)
                         &std::
                          map<int,google::protobuf::internal::ExtensionSet::Extension,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>>
                          ::typeinfo,0x30);
        pKVar3 = (KeyValue *)
                 ArenaImpl::AllocateAlignedAndAddCleanup
                           (this_00,0x30,
                            arena_destruct_object<std::map<int,google::protobuf::internal::ExtensionSet::Extension,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>>>
                           );
        *(undefined8 *)pKVar3 = 0;
        (pKVar3->second).field_0.int64_value = 0;
        (pKVar3->second).type = '\0';
        (pKVar3->second).is_repeated = false;
        (pKVar3->second).field_0xa = 0;
        (pKVar3->second).is_packed = false;
        (pKVar3->second).cached_size = 0;
      }
      (pKVar3->second).descriptor = (FieldDescriptor *)&pKVar3->second;
      *(Extension **)(pKVar3 + 1) = &pKVar3->second;
      pKVar3[1].second.field_0.int64_value = 0;
      (this->map_).flat = pKVar3;
      __pos._M_node = (_Base_ptr)(pKVar3->second).descriptor;
      local_38 = flat;
      for (; flat != pKVar2; flat = flat + 1) {
        local_58.first = flat->first;
        local_58.second.descriptor = (flat->second).descriptor;
        local_58.second.field_0 = (flat->second).field_0;
        local_58.second.type = (flat->second).type;
        local_58.second.is_repeated = (flat->second).is_repeated;
        local_58.second._10_1_ = (flat->second).field_0xa;
        local_58.second.is_packed = (flat->second).is_packed;
        local_58.second.cached_size = (flat->second).cached_size;
        __pos._M_node =
             (_Base_ptr)
             std::
             _Rb_tree<int,std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>,std::_Select1st<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>>
             ::
             _M_insert_unique_<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>
                       ((_Rb_tree<int,std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>,std::_Select1st<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>>
                         *)(this->map_).flat,__pos,&local_58);
      }
      this->flat_size_ = 0;
      flat = local_38;
    }
    if (this->arena_ == (Arena *)0x0) {
      DeleteFlatMap(flat,0);
    }
  }
  return;
}

Assistant:

bool is_large() const { return flat_capacity_ > kMaximumFlatCapacity; }